

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,ConstSchema constant)

{
  PointerReader reader;
  ElementSize expectedElementSize;
  byte bVar1;
  Which WVar2;
  undefined2 uVar3;
  StructDataBitCount SVar4;
  bool bVar5;
  undefined4 uVar6;
  Fault f;
  Reader value;
  Type type;
  Reader local_148;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  void *local_e8;
  SegmentReader *local_e0;
  uint local_d8;
  StructPointerCount local_d4;
  StructDataBitCount local_d0;
  Type local_c8;
  Type local_b8;
  ListReader local_a8;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Schema local_60;
  PointerReader local_58;
  
  this->type = VOID;
  local_60 = constant.super_Schema.raw;
  local_c8 = ConstSchema::getType((ConstSchema *)&local_60);
  Schema::getProto(&local_148,&local_60);
  local_a8.segment = (SegmentReader *)((long)local_148._reader.pointers + 0x20);
  if (local_148._reader.pointerCount < 5) {
    local_a8.segment = (SegmentReader *)0x0;
  }
  if (local_148._reader.pointerCount < 5) {
    local_148._reader.segment._0_4_ = UNKNOWN;
    local_148._reader.segment._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    local_a8.capTable._0_4_ = 0x7fffffff;
  }
  else {
    local_b8.field_4.scopeId._0_4_ = local_148._reader.capTable._0_4_;
    local_b8.field_4.scopeId._4_4_ = local_148._reader.capTable._4_4_;
    local_a8.capTable._0_4_ = local_148._reader.nestingLimit;
  }
  local_b8.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)local_148._reader.segment._4_4_;
  local_b8._6_2_ = SUB42(local_148._reader.segment._4_4_,2);
  local_b8.baseType = (short)(Type)local_148._reader.segment;
  local_b8.listDepth = (char)((Type)local_148._reader.segment >> 0x10);
  local_b8.isImplicitParam = (bool)(char)((Type)local_148._reader.segment >> 0x18);
  capnp::_::PointerReader::getStruct
            ((StructReader *)&stack0xffffffffffffff08,(PointerReader *)&local_b8,(word *)0x0);
  WVar2 = LIST;
  if (local_c8.listDepth == '\0') {
    WVar2 = local_c8.baseType;
  }
  switch(WVar2) {
  case VOID:
    local_148._reader.segment._0_4_ = VOID;
    operator=(this,(Reader *)&local_148);
    break;
  case BOOL:
    if (local_d8 < 0x11) {
      bVar1 = 0;
    }
    else {
      bVar1 = *(byte *)((long)local_e8 + 2) & 1;
    }
    local_148._reader.segment._0_4_ = BOOL;
    local_148._reader.capTable._0_1_ = bVar1;
    operator=(this,(Reader *)&local_148);
    break;
  case INT8:
    if (local_d8 < 0x18) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = (CapTableReader *)(long)*(char *)((long)local_e8 + 2);
    }
    local_148._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_148);
    break;
  case INT16:
    if (local_d8 < 0x20) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = (CapTableReader *)(long)*(short *)((long)local_e8 + 2);
    }
    local_148._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_148);
    break;
  case INT32:
    if (local_d8 < 0x40) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = (CapTableReader *)(long)*(int *)((long)local_e8 + 4);
    }
    local_148._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_148);
    break;
  case INT64:
    if (local_d8 < 0x80) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = *(CapTableReader **)((long)local_e8 + 8);
    }
    local_148._reader.segment._0_4_ = INT;
    operator=(this,(Reader *)&local_148);
    break;
  case UINT8:
    if (local_d8 < 0x18) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = (CapTableReader *)(ulong)*(byte *)((long)local_e8 + 2);
    }
    local_148._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_148);
    break;
  case UINT16:
    if (local_d8 < 0x20) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = (CapTableReader *)(ulong)*(ushort *)((long)local_e8 + 2);
    }
    local_148._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_148);
    break;
  case UINT32:
    if (local_d8 < 0x40) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = (CapTableReader *)(ulong)*(uint *)((long)local_e8 + 4);
    }
    local_148._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_148);
    break;
  case UINT64:
    if (local_d8 < 0x80) {
      local_148._reader.capTable = (CapTableReader *)0x0;
    }
    else {
      local_148._reader.capTable = *(CapTableReader **)((long)local_e8 + 8);
    }
    local_148._reader.segment._0_4_ = UINT;
    operator=(this,(Reader *)&local_148);
    break;
  case FLOAT32:
    local_148._reader.capTable = (CapTableReader *)0x0;
    if (0x3f < local_d8) {
      local_148._reader.capTable = (CapTableReader *)(double)*(float *)((long)local_e8 + 4);
    }
    local_148._reader.segment._0_4_ = FLOAT;
    operator=(this,(Reader *)&local_148);
    break;
  case FLOAT64:
    local_148._reader.capTable._0_4_ = 0;
    local_148._reader.capTable._4_4_ = 0;
    if (0x7f < local_d8) {
      local_148._reader.capTable._0_4_ = (undefined4)*(undefined8 *)((long)local_e8 + 8);
      local_148._reader.capTable._4_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)local_e8 + 8) >> 0x20);
    }
    local_148._reader.segment._0_4_ = FLOAT;
    operator=(this,(Reader *)&local_148);
    break;
  case TEXT:
    bVar5 = local_d4 == 0;
    local_a8.segment = local_e0;
    if (bVar5) {
      local_a8.segment = (SegmentReader *)0x0;
    }
    local_a8.capTable._0_4_ = 0x7fffffff;
    if (!bVar5) {
      local_a8.capTable._0_4_ = local_d0;
    }
    uVar6 = 0;
    local_b8._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    if (!bVar5) {
      uVar6 = in_stack_ffffffffffffff08;
      local_b8._4_4_ = in_stack_ffffffffffffff0c;
      local_b8.field_4.scopeId._0_4_ = uStack_f0;
      local_b8.field_4.scopeId._4_4_ = uStack_ec;
    }
    local_b8.baseType = (short)uVar6;
    local_b8.listDepth = (char)((uint)uVar6 >> 0x10);
    local_b8.isImplicitParam = (bool)(char)((uint)uVar6 >> 0x18);
    local_148._reader._8_16_ =
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_b8,(void *)0x0,0);
    local_148._reader.segment._0_4_ = TEXT;
    operator=(this,(Reader *)&local_148);
    break;
  case DATA:
    bVar5 = local_d4 == 0;
    local_a8.segment = local_e0;
    if (bVar5) {
      local_a8.segment = (SegmentReader *)0x0;
    }
    local_a8.capTable._0_4_ = 0x7fffffff;
    if (!bVar5) {
      local_a8.capTable._0_4_ = local_d0;
    }
    uVar6 = 0;
    local_b8._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    if (!bVar5) {
      uVar6 = in_stack_ffffffffffffff08;
      local_b8._4_4_ = in_stack_ffffffffffffff0c;
      local_b8.field_4.scopeId._0_4_ = uStack_f0;
      local_b8.field_4.scopeId._4_4_ = uStack_ec;
    }
    local_b8.baseType = (short)uVar6;
    local_b8.listDepth = (char)((uint)uVar6 >> 0x10);
    local_b8.isImplicitParam = (bool)(char)((uint)uVar6 >> 0x18);
    local_148._reader._8_16_ =
         capnp::_::PointerReader::getBlob<capnp::Data>((PointerReader *)&local_b8,(void *)0x0,0);
    local_148._reader.segment._0_4_ = DATA;
    operator=(this,(Reader *)&local_148);
    break;
  case LIST:
    bVar5 = local_d4 == 0;
    if (bVar5) {
      local_e0 = (SegmentReader *)0x0;
    }
    SVar4 = 0x7fffffff;
    if (!bVar5) {
      SVar4 = local_d0;
    }
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    if (!bVar5) {
      local_78 = in_stack_ffffffffffffff08;
      uStack_74 = in_stack_ffffffffffffff0c;
      uStack_70 = uStack_f0;
      uStack_6c = uStack_ec;
    }
    local_148._reader._8_16_ = Type::asList(&local_c8);
    local_58.segment = (SegmentReader *)CONCAT44(uStack_74,local_78);
    local_58.capTable = (CapTableReader *)CONCAT44(uStack_6c,uStack_70);
    WVar2 = LIST;
    if (((undefined1  [16])local_148._reader._8_16_ & (undefined1  [16])0xff0000) ==
        (undefined1  [16])0x0) {
      WVar2 = (Which)local_148._reader.capTable;
    }
    local_58.pointer = (WirePointer *)local_e0;
    local_58.nestingLimit = SVar4;
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar2);
    capnp::_::PointerReader::getList(&local_a8,&local_58,expectedElementSize,(word *)0x0);
    local_148._reader.segment._0_4_ = LIST;
    local_148._reader._32_8_ =
         CONCAT44(local_a8.capTable._4_4_,(StructDataBitCount)local_a8.capTable);
    local_148._reader.pointers = (WirePointer *)local_a8.segment;
    local_148._reader._40_8_ = local_a8.ptr;
    uStack_118 = local_a8.elementCount;
    uStack_114 = local_a8.step;
    local_b8 = (Type)local_148._reader._8_16_;
    operator=(this,(Reader *)&local_148);
    break;
  case ENUM:
    local_148._reader.capTable = (CapTableReader *)Type::asEnum(&local_c8);
    if (local_d8 < 0x20) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined2 *)((long)local_e8 + 2);
    }
    local_148._reader.segment._0_4_ = ENUM;
    local_148._reader.data._0_2_ = uVar3;
    operator=(this,(Reader *)&local_148);
    break;
  case STRUCT:
    bVar5 = local_d4 != 0;
    local_a8.segment = (SegmentReader *)0x0;
    if (bVar5) {
      local_a8.segment = local_e0;
    }
    local_a8.capTable._0_4_ = 0x7fffffff;
    if (bVar5) {
      local_a8.capTable._0_4_ = local_d0;
    }
    uVar6 = 0;
    local_b8._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    if (bVar5) {
      uVar6 = in_stack_ffffffffffffff08;
      local_b8._4_4_ = in_stack_ffffffffffffff0c;
      local_b8.field_4.scopeId._0_4_ = uStack_f0;
      local_b8.field_4.scopeId._4_4_ = uStack_ec;
    }
    local_b8.baseType = (short)uVar6;
    local_b8.listDepth = (char)((uint)uVar6 >> 0x10);
    local_b8.isImplicitParam = (bool)(char)((uint)uVar6 >> 0x18);
    Type::asStruct(&local_c8);
    reader.capTable = (CapTableReader *)in_stack_fffffffffffffef8;
    reader.segment = (SegmentReader *)in_stack_fffffffffffffef0;
    reader.pointer = (WirePointer *)in_stack_ffffffffffffff00;
    reader.nestingLimit = in_stack_ffffffffffffff08;
    reader._28_4_ = in_stack_ffffffffffffff0c;
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              (reader,(StructSchema)local_b8.field_4);
    local_148._reader.segment._0_4_ = STRUCT;
    operator=(this,(Reader *)&local_148);
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5ba,FAILED,(char *)0x0,"\"Constants can\'t have interface type.\"",
               (char (*) [37])"Constants can\'t have interface type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_148);
  case ANY_POINTER:
    bVar5 = local_d4 != 0;
    local_148._reader.pointers = (WirePointer *)(SegmentReader *)0x0;
    if (bVar5) {
      local_148._reader.pointers = (WirePointer *)local_e0;
    }
    SVar4 = 0x7fffffff;
    if (bVar5) {
      SVar4 = local_d0;
    }
    local_148._reader.capTable._0_4_ = 0;
    local_148._reader.capTable._4_4_ = 0;
    local_148._reader.data._0_4_ = 0;
    local_148._reader.data._4_4_ = 0;
    if (bVar5) {
      local_148._reader.capTable._0_4_ = in_stack_ffffffffffffff08;
      local_148._reader.capTable._4_4_ = in_stack_ffffffffffffff0c;
      local_148._reader.data._0_4_ = uStack_f0;
      local_148._reader.data._4_4_ = uStack_ec;
    }
    local_148._reader.segment._0_4_ = ANY_POINTER;
    local_148._reader.dataSize = SVar4;
    operator=(this,(Reader *)&local_148);
    break;
  default:
    goto switchD_0021d6c8_default;
  }
  if (((Type)local_148._reader.segment == CAPABILITY) &&
     ((RawBrandedSchema *)local_148._reader.data != (RawBrandedSchema *)0x0)) {
    (*(code *)((Arena *)(local_148._reader.capTable)->_vptr_CapTableReader)->_vptr_Arena)
              (local_148._reader.capTable,
               (long)(RawSchema **)local_148._reader.data +
               *(long *)&(*(RawSchema **)local_148._reader.data)[-1].defaultBrand.scopeCount);
  }
switchD_0021d6c8_default:
  return;
}

Assistant:

DynamicValue::Reader::Reader(ConstSchema constant): type(VOID) {
  auto type = constant.getType();
  auto value = constant.getProto().getConst().getValue();
  switch (type.which()) {
    case schema::Type::VOID: *this = capnp::VOID; break;
    case schema::Type::BOOL: *this = value.getBool(); break;
    case schema::Type::INT8: *this = value.getInt8(); break;
    case schema::Type::INT16: *this = value.getInt16(); break;
    case schema::Type::INT32: *this = value.getInt32(); break;
    case schema::Type::INT64: *this = value.getInt64(); break;
    case schema::Type::UINT8: *this = value.getUint8(); break;
    case schema::Type::UINT16: *this = value.getUint16(); break;
    case schema::Type::UINT32: *this = value.getUint32(); break;
    case schema::Type::UINT64: *this = value.getUint64(); break;
    case schema::Type::FLOAT32: *this = value.getFloat32(); break;
    case schema::Type::FLOAT64: *this = value.getFloat64(); break;
    case schema::Type::TEXT: *this = value.getText(); break;
    case schema::Type::DATA: *this = value.getData(); break;

    case schema::Type::ENUM:
      *this = DynamicEnum(type.asEnum(), value.getEnum());
      break;

    case schema::Type::STRUCT:
      *this = value.getStruct().getAs<DynamicStruct>(type.asStruct());
      break;

    case schema::Type::LIST:
      *this = value.getList().getAs<DynamicList>(type.asList());
      break;

    case schema::Type::ANY_POINTER:
      *this = value.getAnyPointer();
      break;

    case schema::Type::INTERFACE:
      KJ_FAIL_ASSERT("Constants can't have interface type.");
  }
}